

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall
soul::heart::ReadStream::ReadStream
          (ReadStream *this,CodeLocation *l,Expression *dest,InputDeclaration *src)

{
  CodeLocation local_28;
  pool_ptr<soul::heart::Expression> local_18;
  
  local_28.sourceCode.object = (l->sourceCode).object;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  local_28.location.data = (l->location).data;
  local_18.object = dest;
  Assignment::Assignment(&this->super_Assignment,&local_28,&local_18);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.sourceCode.object);
  (this->super_Assignment).super_Statement.super_Object._vptr_Object =
       (_func_int **)&PTR__ReadStream_002da718;
  (this->source).object = src;
  (this->element).object = (Expression *)0x0;
  return;
}

Assistant:

ReadStream (CodeLocation l, Expression& dest, InputDeclaration& src)
            : Assignment (std::move (l), dest), source (src) {}